

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O0

void __thiscall QFileSystemTreeView::QFileSystemTreeView(QFileSystemTreeView *this,QWidget *parent)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  QWidget *in_RSI;
  QTreeView *in_RDI;
  QFileSystemTreeView *in_stack_00000048;
  QFileSystemTreeViewPrivate *in_stack_00000050;
  QString *in_stack_ffffffffffffffc8;
  QFileSystemTreeView *in_stack_ffffffffffffffd0;
  
  QTreeView::QTreeView(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00269f90;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QFileSystemTreeView_0026a2b0;
  pvVar3 = operator_new(0x20);
  QFileSystemTreeViewPrivate::QFileSystemTreeViewPrivate(in_stack_00000050,in_stack_00000048);
  *(void **)(in_RDI + 0x28) = pvVar3;
  QTreeView::setUniformRowHeights(SUB81(in_RDI,0));
  QTreeView::setModel((QAbstractItemModel *)in_RDI);
  QDir::homePath();
  setRootPath(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QString::~QString((QString *)0x22b747);
  bVar1 = (bool)QTreeView::header();
  QHeaderView::setStretchLastSection(bVar1);
  iVar2 = QTreeView::header();
  QHeaderView::setSectionResizeMode(iVar2,Interactive);
  return;
}

Assistant:

QFileSystemTreeView::QFileSystemTreeView(QWidget *parent)
    : QTreeView(parent)
    , d(new QFileSystemTreeViewPrivate(this)) {
    setUniformRowHeights(true);
    QTreeView::setModel(d->model);
    setRootPath(QDir::homePath());
    header()->setStretchLastSection(false);
    header()->setSectionResizeMode(static_cast<int>(QFileSystemTreeView::Column::Name), QHeaderView::Stretch);
}